

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_object_create(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  int64_t iVar4;
  ulong uVar5;
  JSValue JVar6;
  JSValue JVar7;
  JSValue properties;
  
  iVar4 = argv->tag;
  if (((int)iVar4 == -1) || ((int)iVar4 == 2)) {
    JVar6.tag = iVar4;
    JVar6.u.ptr = (argv->u).ptr;
    JVar6 = JS_NewObjectProtoClass(ctx,JVar6,1);
    iVar4 = JVar6.tag;
    JVar2 = JVar6.u;
    if ((uint)JVar6.tag != 6) {
      if (((int)argv[1].tag == 3) ||
         (properties.tag = argv[1].tag, properties.u.ptr = argv[1].u.ptr,
         iVar1 = JS_ObjectDefineProperties(ctx,JVar6,properties), iVar1 == 0)) {
        uVar3 = (ulong)JVar2.ptr & 0xffffffff00000000;
        uVar5 = (ulong)JVar2.ptr & 0xffffffff;
        goto LAB_00162384;
      }
      if ((0xfffffff4 < (uint)JVar6.tag) &&
         (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar6);
      }
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not a prototype",iVar4,CONCAT44(in_register_0000000c,argc));
  }
  uVar5 = 0;
  iVar4 = 6;
  uVar3 = 0;
LAB_00162384:
  JVar7.tag = iVar4;
  JVar7.u.ptr = (void *)(uVar5 | uVar3);
  return JVar7;
}

Assistant:

static JSValue js_object_create(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValueConst proto, props;
    JSValue obj;

    proto = argv[0];
    if (!JS_IsObject(proto) && !JS_IsNull(proto))
        return JS_ThrowTypeError(ctx, "not a prototype");
    obj = JS_NewObjectProto(ctx, proto);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    props = argv[1];
    if (!JS_IsUndefined(props)) {
        if (JS_ObjectDefineProperties(ctx, obj, props)) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    }
    return obj;
}